

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_vobj.c
# Opt level: O0

void vobj_readconv(GlobalVars *gv,LinkFile *lf)

{
  bool bVar1;
  char *pcVar2;
  char *in_RSI;
  ar_info *in_RDI;
  ar_info *in_stack_00000048;
  uint8_t *in_stack_00000058;
  LinkFile *in_stack_00000060;
  GlobalVars *in_stack_00000068;
  unsigned_long in_stack_ffffffffffffffe8;
  
  if (in_RSI[0x39] == '\b') {
    bVar1 = ar_init(in_RDI,in_RSI,in_stack_ffffffffffffffe8,(char *)0x13d4f7);
    if (bVar1 == 0) {
      ierror("vobj_readconv(): archive %s corrupted since last access",
             *(undefined8 *)(in_RSI + 0x10));
    }
    else {
      while (bVar1 = ar_extract(in_stack_00000048), bVar1 != 0) {
        pcVar2 = allocstring(in_RSI);
        *(char **)(in_RSI + 0x20) = pcVar2;
        vobj_read(in_stack_00000068,in_stack_00000060,in_stack_00000058);
      }
    }
  }
  else {
    *(undefined8 *)(in_RSI + 0x20) = *(undefined8 *)(in_RSI + 0x18);
    vobj_read(in_stack_00000068,in_stack_00000060,in_stack_00000058);
  }
  return;
}

Assistant:

static void vobj_readconv(struct GlobalVars *gv,struct LinkFile *lf)
{
  if (lf->type == ID_LIBARCH) {
    if (ar_init(&ai,(char *)lf->data,lf->length,lf->filename)) {
      while (ar_extract(&ai)) {
        lf->objname = allocstring(ai.name);
        vobj_read(gv,lf,(uint8_t *)ai.data);
      }
    }
    else
      ierror("vobj_readconv(): archive %s corrupted since last access",
             lf->pathname);
  }
  else {
    lf->objname = lf->filename;
    vobj_read(gv,lf,lf->data);
  }
}